

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prim-types.cc
# Opt level: O0

Path * __thiscall
tinyusdz::Path::append_element(Path *__return_storage_ptr__,Path *this,string *elem)

{
  bool bVar1;
  ulong uVar2;
  reference pvVar3;
  char *pcVar4;
  long lVar5;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_90;
  uint local_6c;
  undefined1 local_68 [8];
  array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_2UL>
  variant;
  Path *p;
  string *elem_local;
  Path *this_local;
  
  variant._M_elems[1].field_2._8_8_ = this;
  uVar2 = ::std::__cxx11::string::empty();
  if ((uVar2 & 1) == 0) {
    bVar1 = is_variantElementName(elem);
    if (bVar1) {
      ::std::
      array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_2UL>::
      array((array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_2UL>
             *)local_68);
      bVar1 = tokenize_variantElement
                        (elem,(array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_2UL>
                               *)local_68);
      if (bVar1) {
        pvVar3 = ::std::
                 array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_2UL>
                 ::operator[]((array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_2UL>
                               *)local_68,0);
        ::std::__cxx11::string::operator=((string *)&this->_variant_part,(string *)pvVar3);
        pvVar3 = ::std::
                 array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_2UL>
                 ::operator[]((array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_2UL>
                               *)local_68,0);
        ::std::__cxx11::string::operator=((string *)&this->_variant_selection_part,(string *)pvVar3)
        ;
        ::std::__cxx11::string::operator+=((string *)this,(string *)elem);
        ::std::__cxx11::string::operator=((string *)&this->_element,(string *)elem);
        Path(__return_storage_ptr__,(Path *)variant._M_elems[1].field_2._8_8_);
      }
      else {
        *(undefined1 *)(variant._M_elems[1].field_2._8_8_ + 200) = 0;
      }
      local_6c = (uint)bVar1;
      ::std::
      array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_2UL>::
      ~array((array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_2UL>
              *)local_68);
      if (local_6c != 0) {
        return __return_storage_ptr__;
      }
    }
    pcVar4 = (char *)::std::__cxx11::string::operator[]((ulong)elem);
    if (*pcVar4 == '[') {
      *(undefined1 *)(variant._M_elems[1].field_2._8_8_ + 200) = 0;
      Path(__return_storage_ptr__,(Path *)variant._M_elems[1].field_2._8_8_);
    }
    else {
      pcVar4 = (char *)::std::__cxx11::string::operator[]((ulong)elem);
      if (*pcVar4 == '.') {
        *(undefined1 *)(variant._M_elems[1].field_2._8_8_ + 200) = 0;
        Path(__return_storage_ptr__,(Path *)variant._M_elems[1].field_2._8_8_);
      }
      else {
        lVar5 = ::std::__cxx11::string::size();
        if ((lVar5 == 1) &&
           (pcVar4 = (char *)::std::__cxx11::string::operator[](variant._M_elems[1].field_2._8_8_),
           *pcVar4 == '/')) {
          ::std::__cxx11::string::operator+=
                    ((string *)variant._M_elems[1].field_2._8_8_,(string *)elem);
        }
        else {
          ::std::operator+(&local_90,'/',elem);
          ::std::__cxx11::string::operator+=
                    ((string *)variant._M_elems[1].field_2._8_8_,(string *)&local_90);
          ::std::__cxx11::string::~string((string *)&local_90);
        }
        ::std::__cxx11::string::operator=
                  ((string *)(variant._M_elems[1].field_2._8_8_ + 0xa0),(string *)elem);
        Path(__return_storage_ptr__,(Path *)variant._M_elems[1].field_2._8_8_);
      }
    }
  }
  else {
    *(undefined1 *)(variant._M_elems[1].field_2._8_8_ + 200) = 0;
    Path(__return_storage_ptr__,(Path *)variant._M_elems[1].field_2._8_8_);
  }
  return __return_storage_ptr__;
}

Assistant:

Path Path::append_element(const std::string &elem) {
  Path &p = (*this);

  if (elem.empty()) {
    p._valid = false;
    return p;
  }

  // {variant=value}
  if (is_variantElementName(elem)) {
    std::array<std::string, 2> variant;
    if (tokenize_variantElement(elem, &variant)) {
      _variant_part = variant[0];
      _variant_selection_part = variant[0];
      _prim_part += elem;
      _element = elem;
      return p;
    } else {
      p._valid = false;
    }
  }

  if (elem[0] == '[') {
    // relational attrib are not supported
    p._valid = false;
    return p;
  } else if (elem[0] == '.') {
    // Relative path
    // For a while, make this valid.
    p._valid = false;
    return p;
  } else {
    // std::cout << "elem " << elem << "\n";
    if ((p._prim_part.size() == 1) && (p._prim_part[0] == '/')) {
      p._prim_part += elem;
    } else {
      // TODO: Validate element name.
      p._prim_part += '/' + elem;
    }

    // Also store raw element name
    p._element = elem;

    return p;
  }
}